

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O2

uint64_t __thiscall
BMRS_XZ<RemSP>::is_connected(BMRS_XZ<RemSP> *this,uint64_t *flag_bits,uint start,uint end)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = start >> 6;
  uVar5 = (ulong)uVar6;
  if (start == end) {
    uVar2 = 1L << ((byte)start & 0x3f);
  }
  else {
    bVar3 = (byte)start & 0x3f;
    uVar1 = end + 1 >> 6;
    bVar4 = (byte)(end + 1) & 0x3f;
    if (uVar6 != uVar1) {
      do {
        uVar5 = uVar5 + 1;
        if (uVar1 <= uVar5) {
          if (flag_bits[uVar6] >> bVar3 != 0) {
            return 1;
          }
          return (ulong)((flag_bits[uVar1] & ~(-1L << bVar4)) != 0);
        }
      } while (flag_bits[uVar5] == 0);
      return 1;
    }
    uVar2 = -1L << bVar4 ^ -1L << bVar3;
  }
  return uVar2 & flag_bits[uVar5];
}

Assistant:

uint64_t is_connected(const uint64_t* flag_bits, unsigned start, unsigned end) {
        if (start == end) return flag_bits[start >> 6] & ((uint64_t)1 << (start & 0x0000003F));

        unsigned st_base = start >> 6;
        unsigned st_bits = start & 0x0000003F;
        unsigned ed_base = (end + 1) >> 6;
        unsigned ed_bits = (end + 1) & 0x0000003F;
        if (st_base == ed_base) {
            uint64_t cutter = (0xFFFFFFFFFFFFFFFF << st_bits) ^ (0xFFFFFFFFFFFFFFFF << ed_bits);
            return flag_bits[st_base] & cutter;
        }

        for (unsigned i = st_base + 1; i < ed_base; i++) {
            if (flag_bits[i]) return true;
        }
        uint64_t cutter_st = 0xFFFFFFFFFFFFFFFF << st_bits;
        uint64_t cutter_ed = ~(0xFFFFFFFFFFFFFFFF << ed_bits);
        if (flag_bits[st_base] & cutter_st) return true;
        if (flag_bits[ed_base] & cutter_ed) return true;
        return false;
    }